

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

Operation * __thiscall dxil_spv::SPIRVModule::allocate_op(SPIRVModule *this,Op op)

{
  pointer pIVar1;
  Operation *pOVar2;
  Op local_14;
  SPIRVModule *pSStack_10;
  Op op_local;
  SPIRVModule *this_local;
  
  local_14 = op;
  pSStack_10 = this;
  pIVar1 = std::
           unique_ptr<dxil_spv::SPIRVModule::Impl,_std::default_delete<dxil_spv::SPIRVModule::Impl>_>
           ::operator->(&this->impl);
  pOVar2 = ScratchPool<dxil_spv::Operation>::allocate<spv::Op&>(&pIVar1->operation_pool,&local_14);
  return pOVar2;
}

Assistant:

Operation *SPIRVModule::allocate_op(spv::Op op)
{
	return impl->operation_pool.allocate(op);
}